

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O2

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CAssignSubscriptStm *stm)

{
  TypeInfo *left;
  CIdExp *pCVar1;
  IExpression *pIVar2;
  bool bVar3;
  TypeInfo *got;
  string *psVar4;
  undefined1 local_c0 [8];
  string local_b8;
  string errorMessage;
  undefined1 local_70 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  string variableName;
  
  std::operator<<((ostream *)&std::cout,"typechecker: CAssignSubscriptStm\n");
  pCVar1 = (stm->idExpression)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t
           .super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  if (((pCVar1 == (CIdExp *)0x0) ||
      ((stm->indexExpression)._M_t.
       super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
       super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
       super__Head_base<0UL,_IExpression_*,_false>._M_head_impl == (IExpression *)0x0)) ||
     ((stm->valueExpression)._M_t.
      super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
      super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
      super__Head_base<0UL,_IExpression_*,_false>._M_head_impl == (IExpression *)0x0)) {
    CError::CError((CError *)local_c0,&CError::AST_ERROR_abi_cxx11_,
                   &(stm->super_IStatement).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
              (&this->errors,(CError *)local_c0);
    psVar4 = (string *)local_c0;
    goto LAB_0011d02c;
  }
  std::__cxx11::string::string((string *)&variableName,(string *)&pCVar1->name);
  std::__shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2> *)(local_70 + 0x10),
             &(this->currentClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>);
  got = (TypeInfo *)local_70;
  std::__shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2> *)got,
             &(this->currentMethod).super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>);
  bVar3 = checkVariableVisibility
                    (this,&variableName,(shared_ptr<ClassInfo> *)(local_70 + 0x10),
                     (shared_ptr<MethodInfo> *)got);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  if (bVar3) {
    pIVar2 = (stm->indexExpression)._M_t.
             super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
             super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
             super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
    (*(code *)*(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
    TypeInfo::TypeInfo((TypeInfo *)local_c0,ERROR_TYPE);
    left = &this->lastCalculatedType;
    bVar3 = operator==(left,(TypeInfo *)local_c0);
    std::__cxx11::string::~string((string *)(local_c0 + 8));
    if (!bVar3) {
      TypeInfo::TypeInfo((TypeInfo *)local_c0,INT);
      bVar3 = operator!=(left,(TypeInfo *)local_c0);
      std::__cxx11::string::~string((string *)(local_c0 + 8));
      if (bVar3) {
        TypeInfo::TypeInfo((TypeInfo *)local_c0,INT);
        CError::GetTypeErrorMessage_abi_cxx11_(&errorMessage,(CError *)local_c0,left,got);
        std::__cxx11::string::~string((string *)(local_c0 + 8));
        CError::CError((CError *)local_c0,&errorMessage,
                       &(((stm->indexExpression)._M_t.
                          super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t
                          .super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
                          super__Head_base<0UL,_IExpression_*,_false>._M_head_impl)->
                        super_PositionedNode).position);
        std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
                  (&this->errors,(CError *)local_c0);
        std::__cxx11::string::~string((string *)local_c0);
        TypeInfo::TypeInfo((TypeInfo *)local_c0,ERROR_TYPE);
      }
      else {
        pIVar2 = (stm->valueExpression)._M_t.
                 super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
                 super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
                 super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
        (*(code *)*(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
        TypeInfo::TypeInfo((TypeInfo *)local_c0,ERROR_TYPE);
        bVar3 = operator==(left,(TypeInfo *)local_c0);
        std::__cxx11::string::~string((string *)(local_c0 + 8));
        if (bVar3) goto LAB_0011d027;
        TypeInfo::TypeInfo((TypeInfo *)local_c0,INT);
        bVar3 = operator!=(left,(TypeInfo *)local_c0);
        std::__cxx11::string::~string((string *)(local_c0 + 8));
        if (!bVar3) {
          TypeInfo::TypeInfo((TypeInfo *)local_c0,VOID);
          goto LAB_0011d018;
        }
        TypeInfo::TypeInfo((TypeInfo *)local_c0,INT);
        CError::GetTypeErrorMessage_abi_cxx11_(&errorMessage,(CError *)local_c0,left,got);
        std::__cxx11::string::~string((string *)(local_c0 + 8));
        CError::CError((CError *)local_c0,&errorMessage,
                       &(((stm->valueExpression)._M_t.
                          super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t
                          .super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
                          super__Head_base<0UL,_IExpression_*,_false>._M_head_impl)->
                        super_PositionedNode).position);
        std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
                  (&this->errors,(CError *)local_c0);
        std::__cxx11::string::~string((string *)local_c0);
        TypeInfo::TypeInfo((TypeInfo *)local_c0,ERROR_TYPE);
      }
      TypeInfo::operator=(left,(TypeInfo *)local_c0);
      std::__cxx11::string::~string((string *)(local_c0 + 8));
      psVar4 = &errorMessage;
      goto LAB_0011d022;
    }
  }
  else {
    CError::GetUndeclaredErrorMessage(&errorMessage,&variableName);
    CError::CError((CError *)local_c0,&errorMessage,
                   &(stm->super_IStatement).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
              (&this->errors,(CError *)local_c0);
    std::__cxx11::string::~string((string *)local_c0);
    std::__cxx11::string::~string((string *)&errorMessage);
    TypeInfo::TypeInfo((TypeInfo *)local_c0,ERROR_TYPE);
LAB_0011d018:
    TypeInfo::operator=(&this->lastCalculatedType,(TypeInfo *)local_c0);
    psVar4 = (string *)(local_c0 + 8);
LAB_0011d022:
    std::__cxx11::string::~string((string *)psVar4);
  }
LAB_0011d027:
  psVar4 = &variableName;
LAB_0011d02c:
  std::__cxx11::string::~string((string *)psVar4);
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CAssignSubscriptStm &stm ) 
{
    std::cout << "typechecker: CAssignSubscriptStm\n";

    if( stm.idExpression && stm.indexExpression && stm.valueExpression ) {
        auto variableName = stm.idExpression->name;
        bool isVisible = checkVariableVisibility( variableName, currentClass, currentMethod );
        if( !isVisible ) {
            errors.push_back( CError( CError::GetUndeclaredErrorMessage( variableName ), stm.position ) );
            lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
            return;
        }
        stm.indexExpression->Accept( *this );
        if( lastCalculatedType == enums::TPrimitiveType::ERROR_TYPE ) {
            return;
        }
        if( lastCalculatedType != enums::TPrimitiveType::INT ) {
            auto errorMessage = CError::GetTypeErrorMessage( enums::TPrimitiveType::INT, lastCalculatedType );
            errors.push_back( CError( errorMessage, stm.indexExpression->position) );
            lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
            return;
        }
        stm.valueExpression->Accept( *this );
        if( lastCalculatedType == enums::TPrimitiveType::ERROR_TYPE ) {
            return;
        }
        if( lastCalculatedType != enums::TPrimitiveType::INT ) {
            auto errorMessage = CError::GetTypeErrorMessage( enums::TPrimitiveType::INT, lastCalculatedType );
            errors.push_back( CError( errorMessage, stm.valueExpression->position) );
            lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
            return;
        }
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position) );
    }
}